

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O2

int file_truncate(int handle,LONGLONG filesize)

{
  int __fd;
  
  __fd = fileno((FILE *)handleTable[handle].fileptr);
  ftruncate64(__fd,filesize);
  file_seek(handle,filesize);
  handleTable[handle].currentpos = filesize;
  handleTable[handle].last_io_op = 0;
  return 0;
}

Assistant:

int file_truncate(int handle, LONGLONG filesize)
/*
  truncate the diskfile to a new smaller size
*/
{

#ifdef HAVE_FTRUNCATE
    int fdesc;

    fdesc = fileno(handleTable[handle].fileptr);
    ftruncate(fdesc, (OFF_T) filesize);
    file_seek(handle, filesize);

    handleTable[handle].currentpos = filesize;
    handleTable[handle].last_io_op = IO_SEEK;

#endif

    return(0);
}